

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreBinarySerializer.cpp
# Opt level: O3

string * __thiscall
Assimp::Ogre::OgreBinarySerializer::ReadLine_abi_cxx11_
          (string *__return_storage_ptr__,OgreBinarySerializer *this)

{
  StreamReader<false,_false> *this_00;
  uchar uVar1;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  while( true ) {
    this_00 = this->m_reader;
    if (*(int *)&this_00->end == *(int *)&this_00->current) {
      return __return_storage_ptr__;
    }
    uVar1 = StreamReader<false,_false>::Get<unsigned_char>(this_00);
    if (uVar1 == '\n') break;
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string OgreBinarySerializer::ReadLine()
{
    std::string str;
    while(!AtEnd())
    {
        char c = Read<char>();
        if (c == '\n')
            break;
        str += c;
    }
    return str;
}